

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O1

void NULLCCanvas::CanvasDrawPointA(double x,double y,double alpha,Canvas *ptr)

{
  uint y_00;
  uint x_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
    return;
  }
  x_00 = (uint)(long)x;
  y_00 = (uint)(long)y;
  if (ptr->aaEnabled == true) {
    dVar1 = floor(x);
    dVar3 = ((dVar1 - x) + 1.0) * alpha;
    dVar2 = floor(y);
    dVar4 = (dVar2 - y) + 1.0;
    CanvasDrawPointInternal(x_00,y_00,dVar3 * dVar4,ptr);
    dVar1 = (x - dVar1) * alpha;
    CanvasDrawPointInternal(x_00 + 1,y_00,dVar4 * dVar1,ptr);
    y_00 = y_00 + 1;
    CanvasDrawPointInternal(x_00,y_00,dVar3 * (y - dVar2),ptr);
    alpha = (y - dVar2) * dVar1;
    x_00 = x_00 + 1;
  }
  CanvasDrawPointInternal(x_00,y_00,alpha,ptr);
  return;
}

Assistant:

void CanvasDrawPointA(double x, double y, double alpha, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		unsigned xx = unsigned(x);
		unsigned yy = unsigned(y);
		if(ptr->aaEnabled)
		{
			CanvasDrawPointInternal(xx, yy, alpha * rfpart(x) * rfpart(y), ptr);
			CanvasDrawPointInternal(xx + 1, yy, alpha * fpart(x) * rfpart(y), ptr);
			CanvasDrawPointInternal(xx, yy + 1, alpha * rfpart(x) * fpart(y), ptr);
			CanvasDrawPointInternal(xx + 1, yy + 1, alpha * fpart(x) * fpart(y), ptr);
		}else{
			CanvasDrawPointInternal(xx, yy, alpha, ptr);
		}
	}